

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsPSetup(void *ida_mem)

{
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  void *in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                             (IDAMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                             ,(IDALsMem *)0x11bc94);
  if (local_4 == 0) {
    local_4 = (**(code **)(in_stack_ffffffffffffffe0 + 0x100))
                        (*(undefined8 *)((long)in_stack_ffffffffffffffe8 + 0x2a8),
                         *(undefined8 *)((long)in_stack_ffffffffffffffe8 + 0x2b8),
                         *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x48),
                         *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x50),
                         *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x58),
                         *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x118));
    *(long *)(in_stack_ffffffffffffffe0 + 0x88) = *(long *)(in_stack_ffffffffffffffe0 + 0x88) + 1;
  }
  return local_4;
}

Assistant:

int idaLsPSetup(void* ida_mem)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = idals_mem->pset(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                           idals_mem->rcur, IDA_mem->ida_cj, idals_mem->pdata);
  idals_mem->npe++;
  return (retval);
}